

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O2

BigInt<unsigned_int,_unsigned_long> * __thiscall
scp::BigInt<unsigned_int,_unsigned_long>::operator--(BigInt<unsigned_int,_unsigned_long> *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  uint local_c;
  
  if (this->_positive == false) {
    this->_positive = true;
    operator++(this);
  }
  else {
    puVar1 = (this->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    puVar3 = (this->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
    puVar2 = puVar1;
    if (puVar1 != puVar3) {
      do {
        if (puVar2 == puVar3) {
LAB_001051e1:
          for (; puVar1 != puVar3; puVar1 = puVar1 + 1) {
            *puVar1 = 0xffffffff;
          }
          return this;
        }
        if (*puVar2 != 0) {
          *puVar2 = *puVar2 - 1;
          puVar3 = puVar2;
          goto LAB_001051e1;
        }
        puVar2 = puVar2 + 1;
      } while( true );
    }
    local_c = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&this->_values,&local_c);
  }
  this->_positive = false;
  return this;
}

Assistant:

constexpr BigInt<TBase, TBuffer>& BigInt<TBase, TBuffer>::operator--()
	{
		if (!_positive)
		{
			_positive = true;
			++(*this);
			_positive = false;

			return *this;
		}

		if (_values.empty())
		{
			_values.push_back(1);
			_positive = false;
			return *this;
		}

		auto it = _values.begin();
		const auto itEnd = _values.cend();
		while (it != itEnd)
		{
			if (*it != 0)
			{
				--(*it);
				break;
			}
			++it;
		}

		std::fill(_values.begin(), it, _baseMax);

		return *this;
	}